

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printReturn(JSPrinter *this,Ref node)

{
  size_t sVar1;
  bool bVar2;
  Ref *pRVar3;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"return");
  pRVar3 = Ref::operator[](&local_20,1);
  bVar2 = Ref::operator!(pRVar3);
  if (!bVar2) {
    maybeSpace(this,' ');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ' ';
    pRVar3 = Ref::operator[](&local_20,1);
    print(this,pRVar3->inst);
  }
  return;
}

Assistant:

void printReturn(Ref node) {
    emit("return");
    if (!!node[1]) {
      emit(' ');
      print(node[1]);
    }
  }